

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O3

uint32_t FACTWaveBank_Stop(FACTWaveBank *pWaveBank,uint16_t nWaveIndex,uint32_t dwFlags)

{
  LinkedList *pLVar1;
  
  if (pWaveBank != (FACTWaveBank *)0x0) {
    FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);
    for (pLVar1 = pWaveBank->waveList; pLVar1 != (LinkedList *)0x0; pLVar1 = pLVar1->next) {
      if (((FACTWave *)pLVar1->entry)->index == nWaveIndex) {
        FACTWave_Stop((FACTWave *)pLVar1->entry,dwFlags);
      }
    }
    FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
    return 0;
  }
  return 1;
}

Assistant:

uint32_t FACTWaveBank_Stop(
	FACTWaveBank *pWaveBank,
	uint16_t nWaveIndex,
	uint32_t dwFlags
) {
	FACTWave *wave;
	LinkedList *list;
	if (pWaveBank == NULL)
	{
		return 1;
	}
	FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);
	list = pWaveBank->waveList;
	while (list != NULL)
	{
		wave = (FACTWave*) list->entry;
		if (wave->index == nWaveIndex)
		{
			FACTWave_Stop(wave, dwFlags);
		}
		list = list->next;
	}
	FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
	return 0;
}